

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool tdefl_compress_lz_codes(tdefl_compressor *d)

{
  byte bVar1;
  byte bVar2;
  mz_uint8 *pmVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  mz_uint8 *pmVar8;
  mz_uint len_5;
  mz_uint bits_5;
  mz_uint len_4;
  mz_uint bits_4;
  mz_uint lit;
  mz_uint len_3;
  mz_uint bits_3;
  mz_uint len_2;
  mz_uint bits_2;
  mz_uint len_1;
  mz_uint bits_1;
  mz_uint len;
  mz_uint bits;
  mz_uint match_dist;
  mz_uint match_len;
  mz_uint num_extra_bits;
  mz_uint sym;
  mz_uint8 *pLZ_codes;
  mz_uint flags;
  tdefl_compressor *d_local;
  
  pLZ_codes._4_4_ = 1;
  _num_extra_bits = d->m_lz_code_buf;
  do {
    if (d->m_pLZ_code_buf <= _num_extra_bits) {
      uVar5 = (uint)d->m_huff_codes[0][0x100];
      bVar1 = d->m_huff_code_sizes[0][0x100];
      if ((1 << (bVar1 & 0x1f)) - 1U < uVar5) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                      0xc14,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      d->m_bit_buffer = uVar5 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = (uint)bVar1 + d->m_bits_in;
      while (7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar8 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
      return (mz_bool)(d->m_pOutput_buf < d->m_pOutput_buf_end);
    }
    if (pLZ_codes._4_4_ == 1) {
      pLZ_codes._4_4_ = *_num_extra_bits | 0x100;
      _num_extra_bits = _num_extra_bits + 1;
    }
    if ((pLZ_codes._4_4_ & 1) == 0) {
      pmVar8 = _num_extra_bits + 1;
      uVar5 = (uint)*_num_extra_bits;
      if (d->m_huff_code_sizes[0][uVar5] == '\0') {
        __assert_fail("d->m_huff_code_sizes[0][lit]",
                      "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                      0xc0f,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      uVar6 = (uint)d->m_huff_codes[0][uVar5];
      bVar1 = d->m_huff_code_sizes[0][uVar5];
      if ((1 << (bVar1 & 0x1f)) - 1U < uVar6) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                      0xc10,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      d->m_bit_buffer = uVar6 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = (uint)bVar1 + d->m_bits_in;
      while (_num_extra_bits = pmVar8, 7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar3 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar3 + 1;
          *pmVar3 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
    }
    else {
      uVar5 = (uint)*_num_extra_bits;
      uVar4 = *(ushort *)(_num_extra_bits + 1);
      uVar6 = (uint)uVar4;
      _num_extra_bits = _num_extra_bits + 3;
      if (d->m_huff_code_sizes[0][s_tdefl_len_sym[uVar5]] == '\0') {
        __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                      "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                      0xbfd,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      uVar7 = (uint)d->m_huff_codes[0][s_tdefl_len_sym[uVar5]];
      bVar1 = d->m_huff_code_sizes[0][s_tdefl_len_sym[uVar5]];
      if ((1 << (bVar1 & 0x1f)) - 1U < uVar7) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                      0xbff,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      d->m_bit_buffer = uVar7 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = (uint)bVar1 + d->m_bits_in;
      while (7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar8 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
      bVar1 = ""[uVar5];
      if ((1 << (bVar1 & 0x1f)) - 1U < (uVar5 & mz_bitmasks[""[uVar5]])) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                      0xc01,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      d->m_bit_buffer =
           (uVar5 & mz_bitmasks[""[uVar5]]) << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = (uint)bVar1 + d->m_bits_in;
      while (7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar8 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
      if (uVar6 < 0x200) {
        bVar1 = ""[uVar6];
        bVar2 = ""[uVar6];
      }
      else {
        bVar1 = ""[uVar4 >> 8];
        bVar2 = ""[uVar4 >> 8];
      }
      match_len = (mz_uint)bVar1;
      match_dist = (mz_uint)bVar2;
      if (d->m_huff_code_sizes[1][match_len] == '\0') {
        __assert_fail("d->m_huff_code_sizes[1][sym]",
                      "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                      0xc0a,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      uVar5 = (uint)d->m_huff_codes[1][match_len];
      bVar1 = d->m_huff_code_sizes[1][match_len];
      if ((1 << (bVar1 & 0x1f)) - 1U < uVar5) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                      0xc0b,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      d->m_bit_buffer = uVar5 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = (uint)bVar1 + d->m_bits_in;
      while (7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar8 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
      if ((1 << (bVar2 & 0x1f)) - 1U < (uVar6 & mz_bitmasks[match_dist])) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                      0xc0c,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      d->m_bit_buffer =
           (uVar6 & mz_bitmasks[match_dist]) << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = match_dist + d->m_bits_in;
      while (7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar8 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
    }
    pLZ_codes._4_4_ = pLZ_codes._4_4_ >> 1;
  } while( true );
}

Assistant:

static mz_bool tdefl_compress_lz_codes(tdefl_compressor *d) {
  mz_uint flags;
  mz_uint8 *pLZ_codes;

  flags = 1;
  for (pLZ_codes = d->m_lz_code_buf; pLZ_codes < d->m_pLZ_code_buf;
       flags >>= 1) {
    if (flags == 1)
      flags = *pLZ_codes++ | 0x100;
    if (flags & 1) {
      mz_uint sym, num_extra_bits;
      mz_uint match_len = pLZ_codes[0],
              match_dist = (pLZ_codes[1] | (pLZ_codes[2] << 8));
      pLZ_codes += 3;

      MZ_ASSERT(d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]);
      TDEFL_PUT_BITS(d->m_huff_codes[0][s_tdefl_len_sym[match_len]],
                     d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]);
      TDEFL_PUT_BITS(match_len & mz_bitmasks[s_tdefl_len_extra[match_len]],
                     s_tdefl_len_extra[match_len]);

      if (match_dist < 512) {
        sym = s_tdefl_small_dist_sym[match_dist];
        num_extra_bits = s_tdefl_small_dist_extra[match_dist];
      } else {
        sym = s_tdefl_large_dist_sym[match_dist >> 8];
        num_extra_bits = s_tdefl_large_dist_extra[match_dist >> 8];
      }
      MZ_ASSERT(d->m_huff_code_sizes[1][sym]);
      TDEFL_PUT_BITS(d->m_huff_codes[1][sym], d->m_huff_code_sizes[1][sym]);
      TDEFL_PUT_BITS(match_dist & mz_bitmasks[num_extra_bits], num_extra_bits);
    } else {
      mz_uint lit = *pLZ_codes++;
      MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
      TDEFL_PUT_BITS(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);
    }
  }

  TDEFL_PUT_BITS(d->m_huff_codes[0][256], d->m_huff_code_sizes[0][256]);

  return (d->m_pOutput_buf < d->m_pOutput_buf_end);
}